

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O0

void flyd::flyd_master_process_cycle(void)

{
  SourceFile file;
  SourceFile file_00;
  int iVar1;
  LogStream *str;
  sigset_t set;
  LogLevel in_stack_ffffffffffffdf78;
  int in_stack_ffffffffffffdf7c;
  Logger *in_stack_ffffffffffffdf80;
  Logger *this;
  char (*in_stack_ffffffffffffdf88) [102];
  SourceFile *in_stack_ffffffffffffdf90;
  Timestamp in_stack_ffffffffffffdfb0;
  SourceFile local_1058 [253];
  sigset_t local_80;
  
  sigemptyset(&local_80);
  sigaddset(&local_80,0x11);
  sigaddset(&local_80,0xe);
  sigaddset(&local_80,0x1d);
  sigaddset(&local_80,2);
  sigaddset(&local_80,1);
  sigaddset(&local_80,10);
  sigaddset(&local_80,0xc);
  sigaddset(&local_80,0x1c);
  sigaddset(&local_80,0xf);
  sigaddset(&local_80,3);
  iVar1 = sigprocmask(0,&local_80,(sigset_t *)0x0);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<102>(in_stack_ffffffffffffdf90,in_stack_ffffffffffffdf88);
    in_stack_ffffffffffffdf90 = local_1058;
    file._8_8_ = in_stack_ffffffffffffdf90;
    file.data_ = *in_stack_ffffffffffffdf88;
    muduo::Logger::Logger
              (in_stack_ffffffffffffdf80,file,in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78);
    muduo::Logger::stream((Logger *)in_stack_ffffffffffffdf90);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdf90,*in_stack_ffffffffffffdf88);
    muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffdfb0.microSecondsSinceEpoch_);
  }
  flyd_start_worker_processes(0);
  sigemptyset(&local_80);
  iVar1 = sigprocmask(2,&local_80,(sigset_t *)0x0);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<102>(in_stack_ffffffffffffdf90,in_stack_ffffffffffffdf88);
    this = (Logger *)&stack0xffffffffffffdfb0;
    file_00._8_8_ = in_stack_ffffffffffffdf90;
    file_00.data_ = *in_stack_ffffffffffffdf88;
    muduo::Logger::Logger(this,file_00,in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78);
    str = muduo::Logger::stream(this);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdf90,(char *)str);
    muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffdfb0.microSecondsSinceEpoch_);
  }
  dummyFlush();
  do {
    sleep(1);
  } while( true );
}

Assistant:

void flyd_master_process_cycle() {
        sigset_t set;        //信号集

        sigemptyset(&set);   //清空信号集

        //下列这些信号在执行本函数期间不希望收到【考虑到官方nginx中有这些信号，老师就都搬过来了】（保护不希望由信号中断的代码临界区）
        //建议fork()子进程时学习这种写法，防止信号的干扰；
        sigaddset(&set, SIGCHLD);     //子进程状态改变
        sigaddset(&set, SIGALRM);     //定时器超时
        sigaddset(&set, SIGIO);       //异步I/O
        sigaddset(&set, SIGINT);      //终端中断符
        sigaddset(&set, SIGHUP);      //连接断开
        sigaddset(&set, SIGUSR1);     //用户定义信号
        sigaddset(&set, SIGUSR2);     //用户定义信号
        sigaddset(&set, SIGWINCH);    //终端窗口大小改变
        sigaddset(&set, SIGTERM);     //终止
        sigaddset(&set, SIGQUIT);     //终端退出符
        //.........可以根据开发的实际需要往其中添加其他要屏蔽的信号......

        //设置，此时无法接受的信号；阻塞期间，你发过来的上述信号，多个会被合并为一个，暂存着，等你放开信号屏蔽后才能收到这些信号。。。
        //sigprocmask()在第三章第五节详细讲解过 ， 设置信号屏蔽
        if (sigprocmask(SIG_BLOCK, &set, NULL) == -1) //第一个参数用了SIG_BLOCK表明设置 进程 新的信号屏蔽字 为 “当前信号屏蔽字 和 第二个参数指向的信号集的并集
        {
            LOG_ERROR << "信号屏蔽设置失败!";
        }
        //即便sigprocmask失败，程序流程 也继续往下走

        //从配置文件中读取要创建的worker进程数量
//    CConfig *p_config = CConfig::GetInstance(); //单例类
//    int workprocess = p_config->GetIntDefault("WorkerProcesses",1); //从配置文件中得到要创建的worker进程数量
        flyd_start_worker_processes(4);  //这里要创建worker子进程

        //清空信号屏蔽
        sigemptyset(&set); //信号屏蔽字为空，表示不屏蔽任何信号
        if (sigprocmask(SIG_SETMASK, &set, NULL) == -1) //第一个参数用了SIG_BLOCK表明设置 进程 新的信号屏蔽字 为 “当前信号屏蔽字 和 第二个参数指向的信号集的并集
        {
            LOG_ERROR << "清空信号屏蔽失败!";
        }

        dummyFlush();//进入主循环前将日志消息写入文件
        while(1) {

            //    usleep(100000);
            //ngx_log_error_core(0,0,"haha--这是父进程，pid为%P",ngx_pid);

           // sigsuspend(&set); //阻塞在这里，等待一个信号，此时进程是挂起的，不占用cpu时间，只有收到信号才会被唤醒（返回）；

            sleep(1); //休息1秒
            //以后扩充.......

        }// end for(;;)

    }